

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::GetDirFromEnv_abi_cxx11_
                   (initializer_list<const_char_*> environment_variables,char *fallback,
                   char separator)

{
  allocator<char> *__a;
  size_t sVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> in_R8B;
  char *value;
  char *variable_name;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  initializer_list<const_char_*> *in_stack_ffffffffffffff30;
  allocator<char> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_86;
  allocator<char> local_85 [20];
  allocator<char> local_71;
  string local_70 [32];
  allocator<char> *local_50;
  char *local_48;
  const_iterator local_40;
  const_iterator local_38;
  initializer_list<const_char_*> *local_30;
  allocator<char> local_21;
  initializer_list<const_char_*> local_18;
  
  local_30 = &local_18;
  this = in_RDI;
  local_21 = in_R8B;
  local_38 = std::initializer_list<const_char_*>::begin(local_30);
  local_40 = std::initializer_list<const_char_*>::end(in_stack_ffffffffffffff30);
  while( true ) {
    if (local_38 == local_40) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_RDI,in_stack_ffffffffffffff60);
      std::allocator<char>::~allocator(&local_86);
      return this;
    }
    local_48 = *local_38;
    __a = (allocator<char> *)internal::posix::GetEnv((char *)0x19e3ce);
    local_50 = __a;
    if ((__a != (allocator<char> *)0x0) && (*__a != (allocator<char>)0x0)) break;
    local_38 = local_38 + 1;
  }
  sVar1 = strlen((char *)__a);
  if (__a[sVar1 - 1] != local_21) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
    psVar2 = (string *)std::__cxx11::string::append((ulong)local_70,'\x01');
    std::__cxx11::string::string((string *)in_RDI,psVar2);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    return this;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
  std::allocator<char>::~allocator(local_85);
  return this;
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}